

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

size_t __thiscall TcpSocketImpl::PutBackRead(TcpSocketImpl *this,void *buf,size_t len)

{
  int iVar1;
  uchar *__s;
  size_t sVar2;
  unsigned_long __n2;
  __array tmp;
  _Head_base<0UL,_unsigned_char_*,_false> local_30;
  size_t local_28;
  
  if (len == 0 || buf == (void *)0x0) {
    sVar2 = 0;
  }
  else {
    local_28 = len;
    __s = (uchar *)operator_new__(len);
    memset(__s,0,len);
    local_30._M_head_impl = __s;
    memcpy(__s,buf,len);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxInDeque);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    std::
    deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
    ::
    emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
              ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                *)&this->m_quInData,
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_30,
               &local_28);
    LOCK();
    (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i =
         (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i + local_28;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxInDeque);
    sVar2 = local_28;
    if (local_30._M_head_impl != (uchar *)0x0) {
      operator_delete__(local_30._M_head_impl);
    }
  }
  return sVar2;
}

Assistant:

size_t TcpSocketImpl::PutBackRead(void* buf, size_t len)
{
    if (buf == nullptr || len == 0)
        return 0;

    auto tmp = make_unique<uint8_t[]>(len);
    copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
    m_mxInDeque.lock();
    m_quInData.emplace_front(move(tmp), len);
    m_atInBytes += len;
    m_mxInDeque.unlock();

    return len;
}